

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.h
# Opt level: O0

int Ptex::v2_4::PtexUtils::calcResFromWidth(float w)

{
  int result;
  float wf;
  float w_local;
  
  return 0x7f - ((int)w >> 0x17 & 0xffU);
}

Assistant:

inline int calcResFromWidth(float w)
{
    // read exponent directly from float32 representation
    // equiv to ceil(log2(1.0/w)) but much faster and no error
    union {
        float wf;
        int32_t wi;
    };
    wf = w;
    int result = 127 - ((wi >> 23) & 0xff);
    return result;
}